

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Validity * __thiscall
capnp::compiler::CompilerMain::evalConst
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr name)

{
  short sVar1;
  size_t sVar2;
  RawSchema *pRVar3;
  Reader brand;
  undefined1 auVar4 [40];
  Reader reader;
  Reader value_00;
  Field field;
  Reader value_01;
  StringPtr name_00;
  char cVar5;
  Format FVar6;
  int iVar7;
  ConstSchema constant;
  StructSchema schema_00;
  char *pcVar8;
  char *pcVar9;
  Reader *extraout_RDX;
  Reader *extraout_RDX_00;
  Reader *extraout_RDX_01;
  Reader *params;
  Reader *extraout_RDX_02;
  Reader *extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  ProcessContext *pPVar10;
  long lVar11;
  Schema SVar12;
  ReaderFor<capnp::DynamicList> *this_00;
  uint uVar13;
  SegmentReader *pSVar14;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *params_00;
  bool bVar15;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  StringPtr SVar16;
  ReaderOptions options;
  SegmentReader *params_4;
  Schema schema;
  ReaderFor<capnp::DynamicStruct> structValue_1;
  undefined4 local_3c0;
  undefined2 uStack_3bc;
  undefined2 uStack_3ba;
  undefined8 uStack_3b8;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> nameParts;
  StringPtr partName;
  ReaderFor<capnp::DynamicList> listValue;
  Reader value;
  Schema local_2e8;
  ulong local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  ReaderFor<capnp::DynamicStruct> structValue;
  word zeroWord [1];
  IteratorInput<char,_const_char_*> input;
  ReaderFor<DynamicStruct> local_200;
  SegmentArrayMessageReader emptyMessage;
  ReaderFor<DynamicList> local_e8;
  ArrayPtr<const_capnp::word> segments [1];
  Fault f;
  char (*params_2) [19];
  
  input.pos = name.content.ptr;
  if (this->flat == true) {
    FVar6 = this->packed | FLAT;
  }
  else if (this->packed == false) {
    FVar6 = BINARY;
    if (this->binary == false) {
      FVar6 = this->convertTo;
    }
  }
  else {
    FVar6 = PACKED;
  }
  this->convertTo = FVar6;
  lVar11 = (long)(this->sourceFiles).builder.pos - (long)(this->sourceFiles).builder.ptr;
  emptyMessage.super_MessageReader._vptr_MessageReader = (_func_int **)(lVar11 / 0x38);
  emptyMessage.super_MessageReader.options.traversalLimitInWords =
       CONCAT44(emptyMessage.super_MessageReader.options.traversalLimitInWords._4_4_,1);
  emptyMessage.super_MessageReader.options._8_8_ = anon_var_dwarf_48c59;
  emptyMessage.super_MessageReader.arenaSpace[0] = (void *)0x5;
  emptyMessage.super_MessageReader.arenaSpace[1]._0_1_ = lVar11 == 0x38;
  if (!(bool)emptyMessage.super_MessageReader.arenaSpace[1]._0_1_) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x693,FAILED,"sourceFiles.size() == 1","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)&emptyMessage);
    kj::_::Debug::Fault::fatal(&f);
  }
  f.exception = (Exception *)kj::parse::identifier;
  input.end = input.pos + (name.content.size_ - 1);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  nameParts.ptr = (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0;
  nameParts.size_ = 0;
  nameParts.disposer = (ArrayDisposer *)0x0;
  input.best = input.pos;
  kj::parse::
  Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
  ::parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)&value,
             (Sequence_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>,_const_kj::parse::EndOfInput__&>
              *)&f,&input);
  emptyMessage.super_MessageReader._vptr_MessageReader =
       (_func_int **)
       CONCAT71(emptyMessage.super_MessageReader._vptr_MessageReader._1_7_,(undefined1)value.type);
  if ((undefined1)value.type == VOID) {
    emptyMessage.super_MessageReader.options.traversalLimitInWords = value.field_1.uintValue;
    emptyMessage.super_MessageReader.options._8_8_ =
         value.field_1.textValue.super_StringPtr.content.size_;
    emptyMessage.super_MessageReader.arenaSpace[0] = value.field_1.listValue.reader.segment;
    value.field_1.intValue = 0;
    value.field_1.textValue.super_StringPtr.content.size_ = 0;
  }
  kj::_::NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>::
  ~NullableValue((NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)
                 &value);
  cVar5 = (char)emptyMessage.super_MessageReader._vptr_MessageReader;
  if ((char)emptyMessage.super_MessageReader._vptr_MessageReader == '\x01') {
    kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::operator=
              (&nameParts,
               (Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
               &emptyMessage.super_MessageReader.options);
  }
  else {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"invalid syntax");
  }
  kj::_::NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>::
  ~NullableValue((NullableValue<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *)
                 &emptyMessage);
  if (cVar5 == '\0') goto LAB_00123b8b;
  pcVar9 = (char *)((this->sourceFiles).builder.ptr)->id;
  for (params_00 = nameParts.ptr; bVar15 = params_00 != nameParts.ptr + nameParts.size_, bVar15;
      params_00 = params_00 + 1) {
    pcVar8 = "";
    if ((params_00->impl).super_TupleElement<0U,_kj::String>.value.content.size_ != 0) {
      pcVar8 = (params_00->impl).super_TupleElement<0U,_kj::String>.value.content.ptr;
    }
    SVar16.content.size_ = (size_t)pcVar8;
    SVar16.content.ptr = pcVar9;
    Compiler::lookup((Compiler *)&emptyMessage,(uint64_t)(this->compiler).ptr,SVar16);
    if ((char)emptyMessage.super_MessageReader._vptr_MessageReader != '\x01') {
      bVar15 = false;
      break;
    }
    pcVar9 = (char *)emptyMessage.super_MessageReader.options.traversalLimitInWords;
    if ((params_00->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_ != 0) break;
  }
  local_2b8 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  uStack_2b0 = 0x7fffffff;
  params_4 = (SegmentReader *)0x0;
  auVar4 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar4._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar4._8_8_;
  brand._reader.data = (void *)auVar4._16_8_;
  brand._reader.pointers = (WirePointer *)auVar4._24_8_;
  brand._reader.dataSize = auVar4._32_4_;
  brand._reader.pointerCount = auVar4._36_2_;
  brand._reader._38_2_ = auVar4._38_2_;
  schema = SchemaLoader::get(&((this->compiler).ptr)->loader,(uint64_t)pcVar9,brand,(Schema)0x277800
                            );
  value.type = UNKNOWN;
  segments[0].ptr = zeroWord;
  zeroWord[0].content = (word)0;
  segments[0].size_ = 1;
  params_2 = (char (*) [19])0x40;
  segments_00.size_ = 1;
  segments_00.ptr = segments;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&emptyMessage,segments_00,options);
  Schema::getProto((Reader *)&structValue_1,&schema);
  if ((uint)structValue_1.reader.pointers < 0x70) {
LAB_00123697:
    if (bVar15) {
      SVar16 = Schema::getShortDisplayName(&schema);
      listValue.schema.elementType._0_7_ = SVar16.content.ptr._0_7_;
      listValue.schema.elementType._7_1_ = SVar16.content.ptr._7_1_;
      listValue.schema.elementType.field_4.scopeId._0_7_ = SVar16.content.size_._0_7_;
      listValue.schema.elementType.field_4.scopeId._7_1_ = SVar16.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[17]>
                ((String *)&structValue_1,(kj *)0x1f5394,(char (*) [2])&listValue,
                 (StringPtr *)0x1e4b9f,(char (*) [17])&listValue);
    }
    else if (params_00 == nameParts.ptr + nameParts.size_) {
      SVar16 = Schema::getShortDisplayName(&schema);
      listValue.schema.elementType._0_7_ = SVar16.content.ptr._0_7_;
      listValue.schema.elementType._7_1_ = SVar16.content.ptr._7_1_;
      listValue.schema.elementType.field_4.scopeId._0_7_ = SVar16.content.size_._0_7_;
      listValue.schema.elementType.field_4.scopeId._7_1_ = SVar16.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
                ((String *)&structValue_1,(kj *)0x1f5394,(char (*) [2])&listValue,
                 (StringPtr *)"\' cannot be evaluated.",(char (*) [23])&listValue);
    }
    else {
      kj::str<char_const(&)[2],kj::String&,char_const(&)[18]>
                ((String *)&structValue_1,(kj *)0x1f5394,(char (*) [2])params_00,
                 (String *)"\' is not defined.",(char (*) [18])params_2);
    }
LAB_00123b42:
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    this_00 = (ReaderFor<capnp::DynamicList> *)&structValue_1;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
         (char *)structValue_1.schema.super_Schema.raw;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
         (size_t)structValue_1.reader.segment;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
         (ArrayDisposer *)structValue_1.reader.capTable;
    structValue_1.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    structValue_1.reader.segment = (SegmentReader *)0x0;
LAB_00123b6c:
    kj::Array<char>::~Array((Array<char> *)this_00);
  }
  else {
    sVar1 = *(short *)((long)&structValue_1.reader.capTable[1]._vptr_CapTableReader + 4);
    if (sVar1 == 1) {
      if (params_00 != nameParts.ptr + nameParts.size_) {
        schema_00 = Schema::asStruct(&schema);
        MessageReader::getRoot<capnp::DynamicStruct,capnp::StructSchema>
                  ((Reader *)&listValue,&emptyMessage.super_MessageReader,schema_00);
        structValue_1.schema.super_Schema.raw._0_4_ = 10;
        structValue_1.reader.segment =
             (SegmentReader *)
             CONCAT17(listValue.schema.elementType._7_1_,listValue.schema.elementType._0_7_);
        structValue_1.reader.capTable =
             (CapTableReader *)
             CONCAT17(listValue.schema.elementType.field_4.scopeId._7_1_,
                      listValue.schema.elementType.field_4.scopeId._0_7_);
        structValue_1.reader.data =
             (void *)CONCAT17(listValue.reader.segment._7_1_,listValue.reader.segment._0_7_);
        structValue_1.reader.pointers =
             (WirePointer *)
             CONCAT17(listValue.reader.capTable._7_1_,listValue.reader.capTable._0_7_);
        structValue_1.reader._39_1_ = listValue.reader.ptr._7_1_;
        structValue_1.reader._32_7_ = listValue.reader.ptr._0_7_;
        structValue_1.reader._44_4_ = listValue.reader.step;
        structValue_1.reader.nestingLimit = listValue.reader.elementCount;
        _local_3c0 = CONCAT17(listValue.reader._39_1_,listValue.reader._32_7_);
        DynamicValue::Reader::operator=(&value,(Reader *)&structValue_1);
        DynamicValue::Reader::~Reader((Reader *)&structValue_1);
        params = extraout_RDX_00;
        goto LAB_0012379c;
      }
      SVar16 = Schema::getShortDisplayName(&schema);
      listValue.schema.elementType._0_7_ = SVar16.content.ptr._0_7_;
      listValue.schema.elementType._7_1_ = SVar16.content.ptr._7_1_;
      listValue.schema.elementType.field_4.scopeId._0_7_ = SVar16.content.size_._0_7_;
      listValue.schema.elementType.field_4.scopeId._7_1_ = SVar16.content.size_._7_1_;
      kj::str<char_const(&)[2],kj::StringPtr,char_const(&)[23]>
                ((String *)&structValue_1,(kj *)0x1f5394,(char (*) [2])&listValue,
                 (StringPtr *)"\' cannot be evaluated.",(char (*) [23])&listValue);
      goto LAB_00123b42;
    }
    if (sVar1 != 4) goto LAB_00123697;
    constant = Schema::asConst(&schema);
    DynamicValue::Reader::Reader((Reader *)&structValue_1,constant);
    DynamicValue::Reader::operator=(&value,(Reader *)&structValue_1);
    DynamicValue::Reader::~Reader((Reader *)&structValue_1);
    params = extraout_RDX;
LAB_0012379c:
    for (; params_00 != nameParts.ptr + nameParts.size_; params_00 = params_00 + 1) {
      sVar2 = (params_00->impl).super_TupleElement<0U,_kj::String>.value.content.size_;
      pcVar9 = "";
      if (sVar2 != 0) {
        pcVar9 = (params_00->impl).super_TupleElement<0U,_kj::String>.value.content.ptr;
      }
      partName.content.size_ = sVar2 + (sVar2 == 0);
      partName.content.ptr = pcVar9;
      if (!bVar15) {
        if (value.type != STRUCT) {
          kj::str<char_const(&)[2],kj::String&,char_const(&)[19]>
                    ((String *)&structValue_1,(kj *)0x1f5394,(char (*) [2])(params_00 + -1),
                     (String *)"\' is not a struct.",params_2);
          goto LAB_00123b42;
        }
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  (&structValue,&value);
        local_2e8 = structValue.schema.super_Schema.raw;
        name_00.content.size_ = partName.content.size_;
        name_00.content.ptr = partName.content.ptr;
        pcVar9 = (char *)partName.content.size_;
        StructSchema::findFieldByName
                  ((Maybe<capnp::StructSchema::Field> *)&structValue_1,(StructSchema *)&local_2e8,
                   name_00);
        if ((char)structValue_1.schema.super_Schema.raw != '\x01') {
          kj::str<char_const(&)[2],kj::String&,char_const(&)[18],kj::StringPtr&,char_const(&)[3]>
                    ((String *)&structValue_1,(kj *)0x1f5394,(char (*) [2])(params_00 + -1),
                     (String *)"\' has no member \'",(char (*) [18])&partName,(StringPtr *)0x1ee1da,
                     (char (*) [3])params_4);
          goto LAB_00123b42;
        }
        listValue.reader._39_1_ = SUB81(_local_3c0,0);
        listValue.reader._40_7_ = SUB87((ulong)_local_3c0 >> 8,0);
        listValue.reader.ptr._7_1_ = (undefined1)structValue_1.reader.dataSize;
        listValue.reader.elementCount = structValue_1.reader._33_4_;
        listValue.reader.step._0_3_ = structValue_1.reader._37_3_;
        listValue.reader.step._3_1_ = (undefined1)structValue_1.reader.nestingLimit;
        listValue.reader._32_7_ = structValue_1.reader._41_7_;
        listValue.reader.segment._7_1_ = SUB81(structValue_1.reader.data,0);
        listValue.reader.capTable._0_7_ = (undefined7)((ulong)structValue_1.reader.data >> 8);
        listValue.reader.capTable._7_1_ = SUB81(structValue_1.reader.pointers,0);
        listValue.reader.ptr._0_7_ = (undefined7)((ulong)structValue_1.reader.pointers >> 8);
        listValue.schema.elementType._7_1_ = SUB81(structValue_1.reader.segment,0);
        listValue.schema.elementType.field_4.scopeId._0_7_ =
             (undefined7)((ulong)structValue_1.reader.segment >> 8);
        listValue.schema.elementType.field_4.scopeId._7_1_ = SUB81(structValue_1.reader.capTable,0);
        listValue.reader.segment._0_7_ = (undefined7)((ulong)structValue_1.reader.capTable >> 8);
        field._8_8_ = structValue_1.reader.capTable;
        field.parent.super_Schema.raw = (Schema)(Schema)structValue_1.reader.segment;
        field.proto._reader.segment = (SegmentReader *)structValue_1.reader.data;
        field.proto._reader.capTable = (CapTableReader *)structValue_1.reader.pointers;
        field.proto._reader.data = (void *)structValue_1.reader._32_8_;
        field.proto._reader.pointers = (WirePointer *)structValue_1.reader._40_8_;
        field.proto._reader.dataSize = local_3c0;
        field.proto._reader.pointerCount = uStack_3bc;
        field.proto._reader._38_2_ = uStack_3ba;
        field.proto._reader._40_8_ = uStack_3b8;
        params_4 = structValue_1.reader.segment;
        DynamicStruct::Reader::get((Reader *)&structValue_1,&structValue,field);
        DynamicValue::Reader::operator=(&value,(Reader *)&structValue_1);
        DynamicValue::Reader::~Reader((Reader *)&structValue_1);
        params = extraout_RDX_01;
      }
      for (uVar13 = 0; pSVar14 = (SegmentReader *)(ulong)uVar13,
          pSVar14 < (SegmentReader *)
                    (params_00->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_;
          uVar13 = uVar13 + 1) {
        SVar12.raw = (RawBrandedSchema *)
                     (params_00->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr;
        if (value.type != LIST) {
          if (pSVar14 == (SegmentReader *)0x0) {
            kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[17]>
                      ((String *)&structValue_1,(kj *)0x1f5394,(char (*) [2])&partName,
                       (StringPtr *)0x1e4b9f,(char (*) [17])params_2);
            goto LAB_00123b42;
          }
          structValue.schema.super_Schema.raw = (Schema)(Schema)SVar12.raw;
          structValue.reader.segment = pSVar14;
          kj::strArray<kj::ArrayPtr<unsigned_long>>
                    ((String *)&listValue,(kj *)&structValue,(ArrayPtr<unsigned_long> *)"][",pcVar9)
          ;
          kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[18]>
                    ((String *)&structValue_1,(kj *)0x1f5394,(char (*) [2])&partName,
                     (StringPtr *)0x208f8f,(char (*) [2])&listValue,(String *)"]\' is not a list.",
                     (char (*) [18])params_4);
          (__return_storage_ptr__->errorMessage).ptr.isSet = true;
          (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
               (char *)structValue_1.schema.super_Schema.raw;
          (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
               (size_t)structValue_1.reader.segment;
          (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
               (ArrayDisposer *)structValue_1.reader.capTable;
          structValue_1.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
          structValue_1.reader.segment = (SegmentReader *)0x0;
          kj::Array<char>::~Array((Array<char> *)&structValue_1);
          this_00 = &listValue;
          goto LAB_00123b6c;
        }
        pRVar3 = (&(SVar12.raw)->generic)[(long)pSVar14];
        DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&listValue,&value);
        if ((RawSchema *)(ulong)listValue.reader.elementCount <= pRVar3) {
          local_2e0 = (ulong)(uVar13 + 1);
          local_2e8.raw =
               (RawBrandedSchema *)
               (params_00->impl).super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr;
          kj::strArray<kj::ArrayPtr<unsigned_long>>
                    ((String *)&structValue,(kj *)&local_2e8,(ArrayPtr<unsigned_long> *)"][",pcVar9)
          ;
          kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[21]>
                    ((String *)&structValue_1,(kj *)0x1f5394,(char (*) [2])&partName,
                     (StringPtr *)0x208f8f,(char (*) [2])&structValue,
                     (String *)"]\' is out-of-bounds.",(char (*) [21])params_4);
          (__return_storage_ptr__->errorMessage).ptr.isSet = true;
          (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
               (char *)structValue_1.schema.super_Schema.raw;
          (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
               (size_t)structValue_1.reader.segment;
          (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
               (ArrayDisposer *)structValue_1.reader.capTable;
          structValue_1.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
          structValue_1.reader.segment = (SegmentReader *)0x0;
          kj::Array<char>::~Array((Array<char> *)&structValue_1);
          this_00 = (ReaderFor<capnp::DynamicList> *)&structValue;
          goto LAB_00123b6c;
        }
        DynamicList::Reader::operator[]((Reader *)&structValue_1,&listValue,(uint)pRVar3);
        DynamicValue::Reader::operator=(&value,(Reader *)&structValue_1);
        DynamicValue::Reader::~Reader((Reader *)&structValue_1);
        params = extraout_RDX_02;
      }
      bVar15 = false;
    }
    if (this->convertTo == TEXT) {
      if (this->pretty != true) goto LAB_00123d9c;
      if (value.type != LIST) {
        if (value.type != STRUCT) goto LAB_00123d9c;
        pPVar10 = this->context;
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_200,&value)
        ;
        value_00.reader.segment = local_200.reader.segment;
        value_00.schema.super_Schema.raw = local_200.schema.super_Schema.raw;
        value_00.reader.capTable = local_200.reader.capTable;
        value_00.reader.data = local_200.reader.data;
        value_00.reader.pointers = local_200.reader.pointers;
        value_00.reader.dataSize = local_200.reader.dataSize;
        value_00.reader.pointerCount = local_200.reader.pointerCount;
        value_00.reader._38_2_ = local_200.reader._38_2_;
        value_00.reader.nestingLimit = local_200.reader.nestingLimit;
        value_00.reader._44_4_ = local_200.reader._44_4_;
        prettyPrint(value_00);
        kj::StringTree::flatten((String *)&listValue,(StringTree *)&structValue_1);
        lVar11 = CONCAT17(listValue.schema.elementType.field_4.scopeId._7_1_,
                          listValue.schema.elementType.field_4.scopeId._0_7_);
        if (lVar11 == 0) goto LAB_00123e61;
        pcVar9 = (char *)CONCAT17(listValue.schema.elementType._7_1_,
                                  listValue.schema.elementType._0_7_);
        goto LAB_00123e68;
      }
      pPVar10 = this->context;
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_e8,&value);
      value_01.schema.elementType.field_4.schema = local_e8.schema.elementType.field_4.schema;
      value_01.schema.elementType.baseType = local_e8.schema.elementType.baseType;
      value_01.schema.elementType.listDepth = local_e8.schema.elementType.listDepth;
      value_01.schema.elementType.isImplicitParam = local_e8.schema.elementType.isImplicitParam;
      value_01.schema.elementType.field_3 = local_e8.schema.elementType.field_3;
      value_01.schema.elementType._6_2_ = local_e8.schema.elementType._6_2_;
      value_01.reader.segment = local_e8.reader.segment;
      value_01.reader.capTable = local_e8.reader.capTable;
      value_01.reader.ptr = local_e8.reader.ptr;
      value_01.reader.elementCount = local_e8.reader.elementCount;
      value_01.reader.step = local_e8.reader.step;
      value_01.reader.structDataSize = local_e8.reader.structDataSize;
      value_01.reader.structPointerCount = local_e8.reader.structPointerCount;
      value_01.reader.elementSize = local_e8.reader.elementSize;
      value_01.reader._39_1_ = local_e8.reader._39_1_;
      value_01.reader.nestingLimit = local_e8.reader.nestingLimit;
      value_01.reader._44_4_ = local_e8.reader._44_4_;
      prettyPrint(value_01);
      kj::StringTree::flatten((String *)&listValue,(StringTree *)&structValue_1);
      lVar11 = CONCAT17(listValue.schema.elementType.field_4.scopeId._7_1_,
                        listValue.schema.elementType.field_4.scopeId._0_7_);
      if (lVar11 != 0) {
        pcVar9 = (char *)CONCAT17(listValue.schema.elementType._7_1_,
                                  listValue.schema.elementType._0_7_);
        goto LAB_00123e80;
      }
LAB_00123e79:
      pcVar9 = "";
LAB_00123e80:
      iVar7 = (*pPVar10->_vptr_ProcessContext[5])(pPVar10,pcVar9,lVar11 + (ulong)(lVar11 == 0));
      kj::Array<char>::~Array((Array<char> *)&listValue);
      kj::StringTree::~StringTree((StringTree *)&structValue_1);
      SegmentArrayMessageReader::~SegmentArrayMessageReader(&emptyMessage);
      DynamicValue::Reader::~Reader(&value);
      kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array(&nameParts);
      kj::parse::IteratorInput<char,_const_char_*>::~IteratorInput(&input);
      _Unwind_Resume(iVar7);
    }
    if (value.type == STRUCT) {
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&structValue_1,&value);
      (this->rootType).super_Schema.raw = (RawBrandedSchema *)structValue_1.schema.super_Schema.raw;
      listValue.schema.elementType.baseType = 0x85b0;
      listValue.schema.elementType.listDepth = '\'';
      listValue.schema.elementType.isImplicitParam = false;
      listValue.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      listValue.schema.elementType._6_1_ = 0;
      listValue.schema.elementType._7_1_ = 0;
      listValue.schema.elementType.field_4.scopeId._0_7_ = 0xffffff00000001;
      listValue.schema.elementType.field_4.scopeId._7_1_ = 0xff;
      reader._reader.capTable = structValue_1.reader.capTable;
      reader._reader.segment = structValue_1.reader.segment;
      reader._reader.data = structValue_1.reader.data;
      reader._reader.pointers = structValue_1.reader.pointers;
      reader._reader.dataSize = structValue_1.reader.dataSize;
      reader._reader.pointerCount = structValue_1.reader.pointerCount;
      reader._reader._38_2_ = structValue_1.reader._38_2_;
      reader._reader.nestingLimit = structValue_1.reader.nestingLimit;
      reader._reader._44_4_ = structValue_1.reader._44_4_;
      writeConversion(this,reader,(OutputStream *)&listValue);
      (*this->context->_vptr_ProcessContext[1])();
      params = extraout_RDX_03;
LAB_00123d9c:
      pPVar10 = this->context;
      kj::str<capnp::DynamicValue::Reader&>((String *)&structValue_1,(kj *)&value,params);
      SVar12 = structValue_1.schema.super_Schema.raw;
      if (structValue_1.reader.segment == (SegmentReader *)0x0) {
        SVar12.raw = (RawBrandedSchema *)0x20b013;
      }
      (*pPVar10->_vptr_ProcessContext[5])
                (pPVar10,SVar12.raw,
                 (long)&(structValue_1.reader.segment)->arena +
                 (ulong)(structValue_1.reader.segment == (SegmentReader *)0x0));
      lVar11 = extraout_RDX_04;
LAB_00123e61:
      pcVar9 = "";
LAB_00123e68:
      (*pPVar10->_vptr_ProcessContext[5])(pPVar10,pcVar9,lVar11 + (ulong)(lVar11 == 0));
      lVar11 = extraout_RDX_05;
      goto LAB_00123e79;
    }
    kj::MainBuilder::Validity::Validity
              (__return_storage_ptr__,"not a struct; binary output is only available on structs");
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader(&emptyMessage);
  DynamicValue::Reader::~Reader(&value);
LAB_00123b8b:
  kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array(&nameParts);
  kj::parse::IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity evalConst(kj::StringPtr name) {
    convertTo = formatFromDeprecatedFlags(convertTo);

    KJ_ASSERT(sourceFiles.size() == 1);

    auto parser = kj::parse::sequence(
        kj::parse::many(
            kj::parse::sequence(
                kj::parse::identifier,
                kj::parse::many(
                    kj::parse::sequence(
                        kj::parse::exactChar<'['>(),
                        kj::parse::integer,
                        kj::parse::exactChar<']'>())),
                kj::parse::oneOf(
                    kj::parse::endOfInput,
                    kj::parse::sequence(
                        kj::parse::exactChar<'.'>(),
                        kj::parse::notLookingAt(kj::parse::endOfInput))))),
        kj::parse::endOfInput);

    kj::parse::IteratorInput<char, const char*> input(name.begin(), name.end());

    kj::Array<kj::Tuple<kj::String, kj::Array<uint64_t>>> nameParts;
    KJ_IF_SOME(p, parser(input)) {
      nameParts = kj::mv(p);
    } else {
      return "invalid syntax";
    }